

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O1

void __thiscall
btIDebugDraw::drawBox(btIDebugDraw *this,btVector3 *bbMin,btVector3 *bbMax,btVector3 *color)

{
  btScalar local_50;
  undefined4 uStack_4c;
  btScalar local_48;
  undefined4 local_44;
  btScalar local_40;
  btScalar bStack_3c;
  btScalar local_38;
  undefined4 local_34;
  
  local_40 = (btScalar)*(undefined8 *)bbMin->m_floats;
  bStack_3c = (btScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = bbMax->m_floats[0];
  uStack_4c = bStack_3c;
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50);
  bStack_3c = (btScalar)*(undefined8 *)(bbMin->m_floats + 1);
  local_38 = (btScalar)((ulong)*(undefined8 *)(bbMin->m_floats + 1) >> 0x20);
  local_34 = 0;
  local_50 = (btScalar)*(undefined8 *)bbMax->m_floats;
  uStack_4c = (btScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_48 = local_38;
  local_44 = 0;
  local_40 = local_50;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (btScalar)*(undefined8 *)bbMax->m_floats;
  bStack_3c = (btScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = bbMin->m_floats[0];
  uStack_4c = bStack_3c;
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  bStack_3c = bbMax->m_floats[1];
  local_48 = bbMin->m_floats[2];
  local_34 = 0;
  local_50 = (btScalar)*(undefined8 *)bbMin->m_floats;
  uStack_4c = (btScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (btScalar)*(undefined8 *)bbMin->m_floats;
  bStack_3c = (btScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_50 = local_40;
  uStack_4c = bStack_3c;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMax->m_floats[0];
  bStack_3c = (btScalar)*(undefined8 *)(bbMin->m_floats + 1);
  local_38 = (btScalar)((ulong)*(undefined8 *)(bbMin->m_floats + 1) >> 0x20);
  local_34 = 0;
  uStack_4c = bStack_3c;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_40 = local_50;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (btScalar)*(undefined8 *)bbMax->m_floats;
  bStack_3c = (btScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  local_48 = bbMax->m_floats[2];
  local_44 = 0;
  local_50 = local_40;
  uStack_4c = bStack_3c;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_50 = bbMin->m_floats[0];
  local_38 = bbMin->m_floats[2];
  local_34 = 0;
  uStack_4c = (btScalar)*(undefined8 *)(bbMax->m_floats + 1);
  local_48 = (btScalar)((ulong)*(undefined8 *)(bbMax->m_floats + 1) >> 0x20);
  local_44 = 0;
  local_40 = local_50;
  bStack_3c = uStack_4c;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (btScalar)*(undefined8 *)bbMin->m_floats;
  bStack_3c = (btScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = bbMax->m_floats[0];
  uStack_4c = bStack_3c;
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  bStack_3c = bbMin->m_floats[1];
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = (btScalar)*(undefined8 *)bbMax->m_floats;
  uStack_4c = (btScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_44 = 0;
  local_40 = local_50;
  local_38 = local_48;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  local_40 = (btScalar)*(undefined8 *)bbMax->m_floats;
  bStack_3c = (btScalar)((ulong)*(undefined8 *)bbMax->m_floats >> 0x20);
  local_48 = bbMax->m_floats[2];
  local_34 = 0;
  local_50 = bbMin->m_floats[0];
  uStack_4c = bStack_3c;
  local_44 = 0;
  local_38 = local_48;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  bStack_3c = (btScalar)*(undefined8 *)(bbMax->m_floats + 1);
  local_38 = (btScalar)((ulong)*(undefined8 *)(bbMax->m_floats + 1) >> 0x20);
  local_34 = 0;
  local_50 = (btScalar)*(undefined8 *)bbMin->m_floats;
  uStack_4c = (btScalar)((ulong)*(undefined8 *)bbMin->m_floats >> 0x20);
  local_48 = local_38;
  local_44 = 0;
  local_40 = local_50;
  (*this->_vptr_btIDebugDraw[4])(this,&local_40,&local_50,color);
  return;
}

Assistant:

virtual void drawBox(const btVector3& bbMin, const btVector3& bbMax, const btVector3& color)
	{
		drawLine(btVector3(bbMin[0], bbMin[1], bbMin[2]), btVector3(bbMax[0], bbMin[1], bbMin[2]), color);
		drawLine(btVector3(bbMax[0], bbMin[1], bbMin[2]), btVector3(bbMax[0], bbMax[1], bbMin[2]), color);
		drawLine(btVector3(bbMax[0], bbMax[1], bbMin[2]), btVector3(bbMin[0], bbMax[1], bbMin[2]), color);
		drawLine(btVector3(bbMin[0], bbMax[1], bbMin[2]), btVector3(bbMin[0], bbMin[1], bbMin[2]), color);
		drawLine(btVector3(bbMin[0], bbMin[1], bbMin[2]), btVector3(bbMin[0], bbMin[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMin[1], bbMin[2]), btVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMax[1], bbMin[2]), btVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMin[0], bbMax[1], bbMin[2]), btVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMin[0], bbMin[1], bbMax[2]), btVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMin[1], bbMax[2]), btVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMax[1], bbMax[2]), btVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMin[0], bbMax[1], bbMax[2]), btVector3(bbMin[0], bbMin[1], bbMax[2]), color);
	}